

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTransport.cpp
# Opt level: O1

void __thiscall adios2::transport::NullTransport::SeekToEnd(NullTransport *this)

{
  NullTransportImpl *pNVar1;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (((this->Impl)._M_t.
       super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
       .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>.
      _M_head_impl)->IsOpen == false) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Toolkit","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"transport::NullTransport","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"SeekToEnd","");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"transport is not open yet","");
    helper::Throw<std::runtime_error>(&local_48,&local_68,&local_88,&local_a8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  pNVar1 = (this->Impl)._M_t.
           super___uniq_ptr_impl<adios2::transport::NullTransport::NullTransportImpl,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_std::default_delete<adios2::transport::NullTransport::NullTransportImpl>_>
           .super__Head_base<0UL,_adios2::transport::NullTransport::NullTransportImpl_*,_false>.
           _M_head_impl;
  pNVar1->CurPos = pNVar1->Capacity - 1;
  return;
}

Assistant:

void NullTransport::SeekToEnd()
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Toolkit", "transport::NullTransport", "SeekToEnd",
                                          "transport is not open yet");
    }
    Impl->CurPos = Impl->Capacity - 1;
}